

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::IntegerTypeSyntax::setChild(IntegerTypeSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  Token TVar4;
  
  if (index == 2) {
    pSVar3 = TokenOrSyntax::node(&child);
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->dimensions).super_SyntaxListBase.super_SyntaxNode.kind = pSVar3->kind;
    *(undefined4 *)&(this->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar2;
    (this->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar3->previewNode;
    (this->dimensions).super_SyntaxListBase.childCount = *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
    _M_ptr = (pointer)pSVar3[1].parent;
    (this->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
    _M_extent._M_extent_value = (size_t)pSVar1;
  }
  else if (index == 1) {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->signing).kind = TVar4.kind;
    (this->signing).field_0x2 = TVar4._2_1_;
    (this->signing).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->signing).rawLen = TVar4.rawLen;
    (this->signing).info = TVar4.info;
  }
  else {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->keyword).kind = TVar4.kind;
    (this->keyword).field_0x2 = TVar4._2_1_;
    (this->keyword).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->keyword).rawLen = TVar4.rawLen;
    (this->keyword).info = TVar4.info;
  }
  return;
}

Assistant:

void IntegerTypeSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: keyword = child.token(); return;
        case 1: signing = child.token(); return;
        case 2: dimensions = child.node()->as<SyntaxList<VariableDimensionSyntax>>(); return;
        default: SLANG_UNREACHABLE;
    }
}